

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this)

{
  TextReader<fmt::Locale> *pTVar1;
  byte *pbVar2;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this_00;
  bool bVar3;
  int opcode;
  ExprBase EVar4;
  double dVar5;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  pTVar1 = this->reader_;
  pbVar2 = (byte *)(pTVar1->super_ReaderBase).ptr_;
  (pTVar1->super_ReaderBase).token_ = (char *)pbVar2;
  (pTVar1->super_ReaderBase).ptr_ = (char *)(pbVar2 + 1);
  bVar3 = true;
  EVar4.impl_ = (Impl *)(ulong)(*pbVar2 - 0x6c);
  switch(EVar4.impl_) {
  case (Impl *)0x0:
  case (Impl *)0x2:
  case (Impl *)0x7:
    this_00 = this->handler_;
    dVar5 = ReadConstant(this,*pbVar2);
    EVar4.impl_ = (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBool
                                    (this_00,(bool)(-(dVar5 != 0.0) & 1));
    break;
  default:
    goto switchD_00156e40_caseD_1;
  case (Impl *)0x3:
    opcode = ReadOpCode(this);
    EVar4.impl_ = (Impl *)ReadLogicalExpr(this,opcode);
  }
  bVar3 = false;
switchD_00156e40_caseD_1:
  if (bVar3) {
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    local_20.field_1.values_ = (Value *)&local_38;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x1762ab,&local_20
              );
    EVar4.impl_ = (Impl *)0x0;
  }
  return (LogicalExpr)EVar4.impl_;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}